

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseUnqualifiedName(State *state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  State *in_RDI;
  ParseState copy;
  int *in_stack_00000020;
  State *in_stack_00000028;
  ComplexityGuard guard;
  undefined4 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffad;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  undefined1 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb2;
  undefined7 in_stack_ffffffffffffffd0;
  char in_stack_ffffffffffffffd7;
  State *in_stack_ffffffffffffffd8;
  ComplexityGuard in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar11;
  
  anon_unknown_3::ComplexityGuard::ComplexityGuard
            ((ComplexityGuard *)&stack0xffffffffffffffe8,in_RDI);
  bVar4 = anon_unknown_3::ComplexityGuard::IsTooComplex((ComplexityGuard *)&stack0xffffffffffffffe8)
  ;
  if (bVar4) {
    bVar11 = false;
  }
  else {
    uVar5 = ParseOperatorName(in_stack_00000028,in_stack_00000020);
    if (((((bool)uVar5) ||
         (uVar6 = ParseCtorDtorName((State *)CONCAT17(in_stack_ffffffffffffffff,
                                                      in_stack_fffffffffffffff8)), (bool)uVar6)) ||
        (uVar7 = ParseSourceName(in_stack_ffffffffffffffe8.state_), (bool)uVar7)) ||
       ((uVar8 = ParseLocalSourceName(in_stack_ffffffffffffffd8), (bool)uVar8 ||
        (uVar9 = ParseUnnamedTypeName
                           ((State *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)),
        (bool)uVar9)))) {
      bVar11 = ParseAbiTags(in_stack_ffffffffffffffe8.state_);
    }
    else {
      uVar1 = (in_RDI->parse_state).mangled_idx;
      uVar2 = (in_RDI->parse_state).out_cur_idx;
      uVar3 = *(undefined8 *)&(in_RDI->parse_state).prev_name_idx;
      uVar10 = ParseTwoCharToken(in_stack_ffffffffffffffd8,
                                 (char *)CONCAT17(in_stack_ffffffffffffffd7,
                                                  in_stack_ffffffffffffffd0));
      if (((bool)uVar10) &&
         ((in_stack_ffffffffffffffb0 =
                OneOrMore((ParseFunc)
                          CONCAT17(in_stack_ffffffffffffffaf,
                                   CONCAT16(in_stack_ffffffffffffffae,
                                            CONCAT15(in_stack_ffffffffffffffad,
                                                     CONCAT14(in_stack_ffffffffffffffac,
                                                              in_stack_ffffffffffffffa8)))),
                          (State *)0x3cac54), (bool)in_stack_ffffffffffffffb0 &&
          (in_stack_ffffffffffffffaf =
                ParseOneCharToken(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd7),
          (bool)in_stack_ffffffffffffffaf)))) {
        bVar11 = true;
      }
      else {
        (in_RDI->parse_state).mangled_idx = uVar1;
        (in_RDI->parse_state).out_cur_idx = uVar2;
        *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar3;
        bVar4 = ParseOneCharToken(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd7);
        if (((bVar4) &&
            (bVar4 = MaybeAppend((State *)CONCAT17(uVar5,CONCAT16(uVar6,CONCAT15(uVar7,CONCAT14(
                                                  uVar8,CONCAT13(uVar9,CONCAT12(
                                                  in_stack_ffffffffffffffb2,
                                                  CONCAT11(uVar10,in_stack_ffffffffffffffb0))))))),
                                 (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                                  CONCAT16(bVar4,CONCAT15(in_stack_ffffffffffffffad,
                                                                          CONCAT14(
                                                  in_stack_ffffffffffffffac,
                                                  in_stack_ffffffffffffffa8))))), bVar4)) &&
           ((bVar4 = ParseSourceName(in_stack_ffffffffffffffe8.state_), bVar4 ||
            (bVar4 = ParseOperatorName(in_stack_00000028,in_stack_00000020), bVar4)))) {
          bVar11 = true;
        }
        else {
          (in_RDI->parse_state).mangled_idx = uVar1;
          (in_RDI->parse_state).out_cur_idx = uVar2;
          *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar3;
          bVar11 = false;
        }
      }
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard((ComplexityGuard *)&stack0xffffffffffffffe8);
  return (bool)(bVar11 & 1);
}

Assistant:

static bool ParseUnqualifiedName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (ParseOperatorName(state, nullptr) || ParseCtorDtorName(state) ||
      ParseSourceName(state) || ParseLocalSourceName(state) ||
      ParseUnnamedTypeName(state)) {
    return ParseAbiTags(state);
  }

  // DC <source-name>+ E
  ParseState copy = state->parse_state;
  if (ParseTwoCharToken(state, "DC") && OneOrMore(ParseSourceName, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // F <source-name>
  // F <operator-name>
  if (ParseOneCharToken(state, 'F') && MaybeAppend(state, "friend ") &&
      (ParseSourceName(state) || ParseOperatorName(state, nullptr))) {
    return true;
  }
  state->parse_state = copy;

  return false;
}